

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall
soul::AST::BinaryOperator::BinaryOperator
          (BinaryOperator *this,Context *c,Expression *a,Expression *b,Op op)

{
  SourceCodeText *pSVar1;
  Scope *pSVar2;
  
  (this->super_Expression).super_Statement.super_ASTObject.objectType = BinaryOperator;
  pSVar1 = (c->location).sourceCode.object;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object =
       pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pSVar2 = c->parentScope;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.location.data =
       (c->location).location.data;
  (this->super_Expression).super_Statement.super_ASTObject.context.parentScope = pSVar2;
  (this->super_Expression).kind = value;
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__BinaryOperator_002cba40;
  (this->lhs).object = a;
  (this->rhs).object = b;
  this->operation = op;
  (this->resolvedOpTypes).resultType.category = invalid;
  (this->resolvedOpTypes).resultType.arrayElementCategory = invalid;
  (this->resolvedOpTypes).resultType.isRef = false;
  (this->resolvedOpTypes).resultType.isConstant = false;
  (this->resolvedOpTypes).resultType.primitiveType = invalid;
  (this->resolvedOpTypes).resultType.boundingSize = 0;
  (this->resolvedOpTypes).resultType.arrayElementBoundingSize = 0;
  (this->resolvedOpTypes).resultType.structure.object = (Structure *)0x0;
  (this->resolvedOpTypes).operandType.category = invalid;
  (this->resolvedOpTypes).operandType.arrayElementCategory = invalid;
  (this->resolvedOpTypes).operandType.isRef = false;
  (this->resolvedOpTypes).operandType.isConstant = false;
  (this->resolvedOpTypes).operandType.primitiveType = invalid;
  (this->resolvedOpTypes).operandType.boundingSize = 0;
  (this->resolvedOpTypes).operandType.arrayElementBoundingSize = 0;
  (this->resolvedOpTypes).operandType.structure.object = (Structure *)0x0;
  if (((a->kind & ~unknown) == value) && ((b->kind & ~unknown) == value)) {
    return;
  }
  throwInternalCompilerError
            ("isPossiblyValue (lhs.get()) && isPossiblyValue (rhs.get())","BinaryOperator",0x91e);
}

Assistant:

BinaryOperator (const Context& c, Expression& a, Expression& b, BinaryOp::Op op)
           : Expression (ObjectType::BinaryOperator, c, ExpressionKind::value), lhs (a), rhs (b), operation (op)
        {
            SOUL_ASSERT (isPossiblyValue (lhs.get()) && isPossiblyValue (rhs.get()));
        }